

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error
PVG_FT_Stroker_GetBorderCounts
          (PVG_FT_Stroker stroker,PVG_FT_StrokerBorder border,PVG_FT_UInt *anum_points,
          PVG_FT_UInt *anum_contours)

{
  PVG_FT_Error PVar1;
  PVG_FT_UInt num_contours;
  PVG_FT_UInt num_points;
  PVG_FT_UInt local_18 [2];
  
  local_18[0] = 0;
  local_18[1] = 0;
  PVar1 = -1;
  if (border < 2 && stroker != (PVG_FT_Stroker)0x0) {
    ft_stroke_border_get_counts(stroker->borders + border,local_18 + 1,local_18);
    PVar1 = 0;
  }
  if (anum_points != (PVG_FT_UInt *)0x0) {
    *anum_points = local_18[1];
  }
  if (anum_contours != (PVG_FT_UInt *)0x0) {
    *anum_contours = local_18[0];
  }
  return PVar1;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_GetBorderCounts(PVG_FT_Stroker       stroker,
                                          PVG_FT_StrokerBorder border,
                                          PVG_FT_UInt*         anum_points,
                                          PVG_FT_UInt*         anum_contours)
{
    PVG_FT_UInt  num_points = 0, num_contours = 0;
    PVG_FT_Error error;

    if (!stroker || border > 1) {
        error = -1;  // PVG_FT_THROW( Invalid_Argument );
        goto Exit;
    }

    error = ft_stroke_border_get_counts(stroker->borders + border, &num_points,
                                        &num_contours);
Exit:
    if (anum_points) *anum_points = num_points;

    if (anum_contours) *anum_contours = num_contours;

    return error;
}